

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# button.cpp
# Opt level: O2

Element __thiscall ftxui::anon_unknown_3::ButtonBase::Render(ButtonBase *this)

{
  char cVar1;
  Components *pCVar2;
  bool bVar3;
  Components *pCVar4;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  ComponentBase *in_RSI;
  ComponentBase *pCVar5;
  code *pcVar6;
  Element EVar7;
  undefined1 local_e0 [16];
  Element local_d0;
  Element local_c0;
  Decorator local_b0;
  _Any_data local_90;
  code *local_80;
  code *local_78;
  _Any_data local_70;
  code *local_60;
  code *local_58;
  string local_50 [32];
  
  bVar3 = ComponentBase::Focused(in_RSI);
  if (bVar3) {
    pcVar6 = inverted;
  }
  else {
    pcVar6 = nothing;
  }
  pCVar2 = (Components *)
           in_RSI[3].children_.
           super__Vector_base<std::shared_ptr<ftxui::ComponentBase>,_std::allocator<std::shared_ptr<ftxui::ComponentBase>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pCVar4 = &in_RSI[3].children_;
  if (pCVar2 != (Components *)0x0) {
    pCVar4 = pCVar2;
  }
  cVar1 = *(char *)&(pCVar4->
                    super__Vector_base<std::shared_ptr<ftxui::ComponentBase>,_std::allocator<std::shared_ptr<ftxui::ComponentBase>_>_>
                    )._M_impl.super__Vector_impl_data._M_start;
  pCVar5 = in_RSI + 1;
  if (in_RSI[1].parent_ != (ComponentBase *)0x0) {
    pCVar5 = in_RSI[1].parent_;
  }
  std::__cxx11::string::string(local_50,(string *)pCVar5);
  text((string *)local_e0);
  if (cVar1 == '\0') {
    local_70._M_unused._M_object = nothing;
  }
  else {
    local_70._M_unused._M_object = border;
  }
  local_70._8_8_ = 0;
  local_58 = std::
             _Function_handler<std::shared_ptr<ftxui::Node>_(std::shared_ptr<ftxui::Node>),_std::shared_ptr<ftxui::Node>_(*)(std::shared_ptr<ftxui::Node>)>
             ::_M_invoke;
  local_60 = std::
             _Function_handler<std::shared_ptr<ftxui::Node>_(std::shared_ptr<ftxui::Node>),_std::shared_ptr<ftxui::Node>_(*)(std::shared_ptr<ftxui::Node>)>
             ::_M_manager;
  operator|((ftxui *)&local_d0,(Element *)local_e0,(Decorator *)&local_70);
  local_90._8_8_ = 0;
  local_78 = std::
             _Function_handler<std::shared_ptr<ftxui::Node>_(std::shared_ptr<ftxui::Node>),_std::shared_ptr<ftxui::Node>_(*)(std::shared_ptr<ftxui::Node>)>
             ::_M_invoke;
  local_80 = std::
             _Function_handler<std::shared_ptr<ftxui::Node>_(std::shared_ptr<ftxui::Node>),_std::shared_ptr<ftxui::Node>_(*)(std::shared_ptr<ftxui::Node>)>
             ::_M_manager;
  local_90._M_unused._M_function_pointer = pcVar6;
  operator|((ftxui *)&local_c0,&local_d0,(Decorator *)&local_90);
  reflect((Box *)&in_RSI[2].parent_);
  operator|((ftxui *)this,&local_c0,&local_b0);
  std::_Function_base::~_Function_base(&local_b0.super__Function_base);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_c0.super___shared_ptr<ftxui::Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::_Function_base::~_Function_base((_Function_base *)&local_90);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_d0.super___shared_ptr<ftxui::Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::_Function_base::~_Function_base((_Function_base *)&local_70);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_e0 + 8));
  std::__cxx11::string::~string(local_50);
  EVar7.super___shared_ptr<ftxui::Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  EVar7.super___shared_ptr<ftxui::Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (Element)EVar7.super___shared_ptr<ftxui::Node,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Element Render() override {
    auto style = Focused() ? inverted : nothing;
    auto my_border = option_->border ? border : nothing;
    return text(*label_) | my_border | style | reflect(box_);
  }